

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

bool ReadImage(string *path,shared_ptr<Disk> *disk,bool normalise)

{
  uint uVar1;
  Compress CVar2;
  ulong uVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  string *psVar6;
  string *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  exception *peVar11;
  bool bVar12;
  allocator<char> local_131;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  Compress local_e4;
  string local_e0;
  IMAGE_ENTRY *local_c0;
  IMAGE_ENTRY *p_1;
  DEVICE_ENTRY *local_b0;
  DEVICE_ENTRY *p;
  byte local_91;
  undefined1 local_90 [7];
  bool f;
  MemFile file;
  bool normalise_local;
  shared_ptr<Disk> *disk_local;
  string *path_local;
  
  file._103_1_ = normalise;
  MemFile::MemFile((MemFile *)local_90);
  local_91 = 0;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    peVar11 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[19]>(peVar11,(char (*) [19])"invalid empty path");
    __cxa_throw(peVar11,&util::exception::typeinfo,util::exception::~exception);
  }
  local_b0 = aDeviceTypes;
  while( true ) {
    bVar12 = false;
    if ((local_91 & 1) == 0) {
      bVar12 = local_b0->pszType != (char *)0x0;
    }
    if (!bVar12) break;
    if (local_b0->pfnRead != (DEVICE_READFUNC)0x0) {
      local_91 = (*local_b0->pfnRead)(path,disk);
    }
    local_b0 = local_b0 + 1;
  }
  if (((local_91 & 1) == 0) && (bVar12 = IsDir(path), bVar12)) {
    peVar11 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[20]>(peVar11,(char (*) [20])"path is a directory");
    __cxa_throw(peVar11,&util::exception::typeinfo,util::exception::~exception);
  }
  if ((local_91 & 1) == 0) {
    uVar1 = MemFile::open((MemFile *)local_90,(char *)path,(uint)(opt.nozip == 0));
    if ((uVar1 & 1) == 0) {
      path_local._7_1_ = false;
      goto LAB_002197d9;
    }
    local_c0 = aImageTypes;
    while( true ) {
      bVar12 = false;
      if ((local_91 & 1) == 0) {
        bVar12 = local_c0->pszType != (char *)0x0;
      }
      if (!bVar12) break;
      if (local_c0->pfnRead != (IMAGE_READFUNC)0x0) {
        local_91 = (*local_c0->pfnRead)((MemFile *)local_90,disk);
      }
      local_c0 = local_c0 + 1;
    }
    if ((local_91 & 1) != 0) {
      CVar2 = MemFile::compression((MemFile *)local_90);
      if (CVar2 != None) {
        local_e4 = MemFile::compression((MemFile *)local_90);
        to_string_abi_cxx11_(&local_e0,&local_e4);
        peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            disk);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"archive",&local_109);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&peVar4->metadata,&local_108);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      psVar6 = MemFile::path_abi_cxx11_((MemFile *)local_90);
      psVar7 = MemFile::name_abi_cxx11_((MemFile *)local_90);
      lVar8 = std::__cxx11::string::rfind((string *)psVar6,(ulong)psVar7);
      MemFile::name_abi_cxx11_((MemFile *)local_90);
      lVar9 = std::__cxx11::string::size();
      MemFile::path_abi_cxx11_((MemFile *)local_90);
      lVar10 = std::__cxx11::string::size();
      if (lVar8 + lVar9 != lVar10) {
        psVar6 = MemFile::name_abi_cxx11_((MemFile *)local_90);
        peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            disk);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"filename",&local_131);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&peVar4->metadata,&local_130);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
      }
    }
  }
  if ((local_91 & 1) == 0) {
    peVar11 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[31]>
              (peVar11,(char (*) [31])"unrecognised disk image format");
    __cxa_throw(peVar11,&util::exception::typeinfo,util::exception::~exception);
  }
  if ((file._103_1_ & 1) != 0) {
    if (opt.fix == 1) {
      FixPlus3BootLoader(disk);
    }
    if (opt.flip != 0) {
      peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          disk);
      Disk::flip_sides(peVar4);
    }
  }
  path_local._7_1_ = (bool)(local_91 & 1);
LAB_002197d9:
  p_1._4_4_ = 1;
  MemFile::~MemFile((MemFile *)local_90);
  return path_local._7_1_;
}

Assistant:

bool ReadImage(const std::string& path, std::shared_ptr<Disk>& disk, bool normalise)
{
    MemFile file;
    bool f = false;

    if (path.empty())
        throw util::exception("invalid empty path");

    // Try devices first as the path may use a custom syntax
    for (auto p = aDeviceTypes; !f && p->pszType; ++p)
    {
        if (p->pfnRead) f = p->pfnRead(path, disk);
    }

    if (!f && IsDir(path))
        throw util::exception("path is a directory");

    // Next try regular files (and archives)
    if (!f)
    {
        if (!file.open(path, !opt.nozip))
            return false;

        // Present the image to all types with read support
        for (auto p = aImageTypes; !f && p->pszType; ++p)
        {
            if (p->pfnRead) f = p->pfnRead(file, disk);
        }

        // Store the archive type the image was found in, if any
        if (f)
        {
            if (file.compression() != Compress::None)
                disk->metadata["archive"] = to_string(file.compression());
            if (file.path().rfind(file.name()) + file.name().size() != file.path().size())
                disk->metadata["filename"] = file.name();
        }
    }

#if 0
    // Unwrap any sub-containers
    if (!f) f = UnwrapSDF(olddisk, disk);   // MakeSDF image
    if (!f) f = UnwrapCPM(olddisk, disk);   // BDOS CP/M record format
#endif

    if (!f)
        throw util::exception("unrecognised disk image format");

    if (normalise)
    {
        // ToDo: Make resize and flip optional?  replace fNormalise) and fLoadFilter_?
#if 0 // breaks with sub-ranges
        if (!opt.range.empty())
            disk->resize(opt.range.cyls(), opt.range.heads());
#endif
        // Forcibly correct +3 boot loader problems?
        if (opt.fix == 1)
            FixPlus3BootLoader(disk);

        if (opt.flip)
            disk->flip_sides();
    }

#if 0
    auto cyls = disk->cyls(), heads = disk->heads();
    for (uint8_t head = 0; head < heads; ++head)
    {
        // Determine any forced head value for sectors on this track (-1 for none)
        int nHeadVal = head ? opt.head1 : opt.head0;

        // If nothing forced and we're using a regular format, use its head values
        if (nHeadVal == -1 && olddisk->format.sectors)
            nHeadVal = head ? olddisk->format.head1 : olddisk->format.head0;

        for (uint8_t cyl = 0; cyl < cyls; ++cyl)
        {
            PTRACK pt = disk->GetTrack(cyl, head);

            // Optionally normalise the track, to allow 'scan' to normalise on the fly
            if (fNormalise_)
                pt->Normalise(fLoadFilter_);

            // Forced head?
            if (nHeadVal != -1)
            {
                for (int i = 0; i < pt->sectors; ++i)
                    pt->sector[i].head = nHeadVal;
            }
        }
    }
#endif

    return f;
}